

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  BCWriteCtx *in_RSI;
  uint *in_RDI;
  char *q;
  MSize nn;
  MSize n_1;
  GCobj *o;
  GCRef *kr;
  ptrdiff_t n;
  ptrdiff_t i;
  char *p;
  MSize sizedbg;
  MSize in_stack_ffffffffffffff3c;
  SBuf *in_stack_ffffffffffffff40;
  GCproto *in_stack_ffffffffffffff60;
  GCproto *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  GCproto *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t v;
  char *local_50;
  char *local_8;
  
  v = 0;
  if (((ulong)in_RSI->wdata & 0x10000000000) != 0) {
    in_stack_ffffffffffffff70 = (char *)(ulong)*(uint *)&in_RSI->wfunc;
    in_stack_ffffffffffffff68 = (GCproto *)(ulong)*(uint *)&in_RSI->pt;
    for (in_stack_ffffffffffffff78 = (GCproto *)0x0;
        in_stack_ffffffffffffff68 = (GCproto *)((long)in_stack_ffffffffffffff68 - 4),
        (long)in_stack_ffffffffffffff78 < (long)in_stack_ffffffffffffff70;
        in_stack_ffffffffffffff78 =
             (GCproto *)((long)&(((SBuf *)&in_stack_ffffffffffffff78->nextgc)->p).ptr32 + 1)) {
      in_stack_ffffffffffffff60 = (GCproto *)(ulong)*(uint *)in_stack_ffffffffffffff68;
      if (in_stack_ffffffffffffff60->gct == '\a') {
        bcwrite_proto(in_RSI,(GCproto *)CONCAT44(v,in_stack_ffffffffffffff88));
      }
    }
  }
  if (in_RDI[1] - in_RDI[2] <
      ((in_RSI->sb).b.ptr32 - 1) * 4 + 0x27 + (uint)*(byte *)((long)&in_RSI->wdata + 4) * 2) {
    local_50 = lj_buf_need2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  }
  else {
    local_50 = (char *)(ulong)in_RDI[2];
  }
  local_50[5] = *(byte *)((long)&in_RSI->wdata + 5) & 7;
  local_50[6] = *(char *)((long)&(in_RSI->sb).e.ptr32 + 2);
  local_50[7] = *(char *)((long)&(in_RSI->sb).e.ptr32 + 3);
  local_50[8] = *(char *)((long)&in_RSI->wdata + 4);
  pcVar5 = lj_strfmt_wuleb128(local_50 + 9,*(uint32_t *)&in_RSI->wfunc);
  pcVar5 = lj_strfmt_wuleb128(pcVar5,*(uint32_t *)((long)&in_RSI->wfunc + 4));
  pcVar5 = lj_strfmt_wuleb128(pcVar5,(in_RSI->sb).b.ptr32 - 1);
  if (in_RDI[10] == 0) {
    if (in_RSI[1].sb.e.ptr32 != 0) {
      v = *(int *)&in_RSI->wdata - (in_RSI[1].sb.e.ptr32 - (int)in_RSI);
    }
    pcVar5 = lj_strfmt_wuleb128(pcVar5,v);
    if (v != 0) {
      pcVar5 = lj_strfmt_wuleb128(pcVar5,in_RSI->status);
      lj_strfmt_wuleb128(pcVar5,in_RSI[1].sb.p.ptr32);
    }
  }
  pcVar5 = bcwrite_bytecode((BCWriteCtx *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff68);
  bVar1 = *(byte *)((long)&in_RSI->wdata + 4);
  memcpy(pcVar5,(void *)(ulong)*(uint *)((long)&in_RSI->pt + 4),(ulong)bVar1 << 1);
  *in_RDI = (uint)(BCWriteCtx *)(pcVar5 + (ulong)bVar1 * 2);
  bcwrite_kgc((BCWriteCtx *)(pcVar5 + (ulong)bVar1 * 2),in_stack_ffffffffffffff78);
  bcwrite_knum((BCWriteCtx *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (v != 0) {
    if (in_RDI[1] - *in_RDI < v) {
      local_8 = lj_buf_more2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    }
    else {
      local_8 = (char *)(ulong)*in_RDI;
    }
    memcpy(local_8,(void *)(ulong)in_RSI[1].sb.e.ptr32,(ulong)v);
    *in_RDI = (int)local_8 + v;
  }
  if (in_RDI[0xb] == 0) {
    uVar3 = (*in_RDI - in_RDI[2]) - 5;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar4 = (uint)((iVar2 + 8) * 9) >> 6;
    pcVar5 = (char *)((ulong)in_RDI[2] + (ulong)(5 - uVar4));
    lj_strfmt_wuleb128(pcVar5,uVar3);
    uVar3 = (**(code **)(in_RDI + 6))(in_RDI[3],pcVar5,uVar4 + uVar3,*(undefined8 *)(in_RDI + 8));
    in_RDI[0xb] = uVar3;
  }
  return;
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  setsbufP(&ctx->sb, p);

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    setsbufP(&ctx->sb, p);
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = sbufB(&ctx->sb) + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == sbufB(&ctx->sb) + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}